

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::InvalidateDefaultSubFramebufferRenderCase::render
          (InvalidateDefaultSubFramebufferRenderCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 program;
  int iVar4;
  Context *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  Vec4 local_1b8;
  Surface *local_1a0;
  Vec3 local_198;
  FlatColorShader flatShader;
  
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  local_1a0 = dst;
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  iVar1 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments(&attachments,this->m_buffers);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar5->_vptr_Context[0x75])(pCVar5,&flatShader);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 0.0;
  local_1b8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar5,program,&local_1b8);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data[2] = -1.0;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 1.0;
  sglr::drawQuad(pCVar5,program,(Vec3 *)&local_1b8,&local_198);
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),
             attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,iVar4 >> 2,iVar1 >> 2,iVar2 / 2,iVar3 / 2);
  sglr::ContextWrapper::glClearColor(this_00,0.0,1.0,0.0,1.0);
  sglr::ContextWrapper::glClearStencil(this_00,1);
  sglr::ContextWrapper::glScissor(this_00,iVar4 >> 2,iVar1 >> 2,iVar2 / 2,iVar3 / 2);
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  sglr::ContextWrapper::glClear(this_00,this->m_buffers);
  sglr::ContextWrapper::glDisable(this_00,0xc11);
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 1.0;
  local_1b8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar5,program,&local_1b8);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data._8_8_ = local_1b8.m_data._8_8_ & 0xffffffff00000000;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 0.0;
  sglr::drawQuad(pCVar5,program,(Vec3 *)&local_1b8,&local_198);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar1 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&this->super_FboTestCase,local_1a0,0,0,iVar4,iVar1);
  if (attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		int					invalidateX		= getWidth()	/ 4;
		int					invalidateY		= getHeight()	/ 4;
		int					invalidateW		= getWidth()	/ 2;
		int					invalidateH		= getHeight()	/ 2;
		FlatColorShader		flatShader		(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments		= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID	= getCurrentContext()->createProgram(&flatShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Clear invalidated buffers.
		glClearColor	(0.0f, 1.0f, 0.0f, 1.0f);
		glClearStencil	(1);
		glScissor		(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable		(GL_SCISSOR_TEST);
		glClear			(m_buffers);
		glDisable		(GL_SCISSOR_TEST);

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}